

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.cc
# Opt level: O0

void __thiscall ReportAsync::~ReportAsync(ReportAsync *this)

{
  bool bVar1;
  ostream *this_00;
  undefined8 *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  AutoThreadCrosser *in_stack_ffffffffffffffe0;
  unique_ptr<std::thread,_std::default_delete<std::thread>_> *in_stack_fffffffffffffff0;
  
  *in_RDI = &PTR__ReportAsync_00115c38;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined1 *)(in_RDI + 1) = 1;
  std::condition_variable::notify_all();
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x10c829);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)0x10c83a);
  if (bVar1) {
    in_stack_ffffffffffffffe0 =
         (AutoThreadCrosser *)
         std::operator<<((ostream *)&std::cerr,"Waiting for reporter thread to finish...");
    std::ostream::operator<<
              ((ostream *)in_stack_ffffffffffffffe0,std::endl<char,std::char_traits<char>>);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator->
              ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)0x10c87e);
    std::thread::join();
    this_00 = std::operator<<((ostream *)&std::cerr,"Reporter thread finished.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  capture_thread::ThreadCapture<Reporter>::AutoThreadCrosser::~AutoThreadCrosser
            (in_stack_ffffffffffffffe0);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            (in_stack_fffffffffffffff0);
  std::
  queue<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::deque<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~queue((queue<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::deque<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)0x10c8e5);
  std::condition_variable::~condition_variable((condition_variable *)(in_RDI + 7));
  Reporter::~Reporter((Reporter *)0x10c8fd);
  return;
}

Assistant:

~ReportAsync() {
    {
      std::lock_guard<std::mutex> lock(queue_lock_);
      terminated_ = true;
      queue_wait_.notify_all();
    }
    if (reporter_thread_) {
      std::cerr << "Waiting for reporter thread to finish..." << std::endl;
      reporter_thread_->join();
      std::cerr << "Reporter thread finished." << std::endl;
    }
  }